

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::ConstraintBlockSymbol::ConstraintBlockSymbol
          (ConstraintBlockSymbol *this,Compilation *c,string_view name,SourceLocation loc)

{
  string_view name_00;
  Scope *in_RCX;
  Compilation *in_RDX;
  Symbol *in_RDI;
  SourceLocation in_R8;
  
  name_00._M_str = (char *)in_RCX;
  name_00._M_len = (size_t)in_RDX;
  Symbol::Symbol(in_RDI,ConstraintBlock,name_00,in_R8);
  Scope::Scope(in_RCX,in_RDX,(Symbol *)in_R8);
  in_RDI[1].originatingSyntax = (SyntaxNode *)0x0;
  bitmask<slang::ast::ConstraintBlockFlags>::bitmask
            ((bitmask<slang::ast::ConstraintBlockFlags> *)(in_RDI + 2));
  in_RDI[2].name._M_len = 0;
  *(undefined4 *)&in_RDI[2].name._M_str = 0;
  return;
}

Assistant:

ConstraintBlockSymbol::ConstraintBlockSymbol(Compilation& c, std::string_view name,
                                             SourceLocation loc) :
    Symbol(SymbolKind::ConstraintBlock, name, loc), Scope(c, this) {
}